

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O0

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)4>::
dispatch<true,TI::TMS::CharacterSequencer<(TI::TMS::Personality)4>>
          (Base<(TI::TMS::Personality)4> *this,CharacterSequencer<(TI::TMS::Personality)4> *fetcher,
          int start,int end)

{
  int end_local;
  int start_local;
  CharacterSequencer<(TI::TMS::Personality)4> *fetcher_local;
  Base<(TI::TMS::Personality)4> *this_local;
  
  switch(start) {
  case 0:
    break;
  case 1:
    goto switchD_0025d837_caseD_1;
  case 2:
    goto switchD_0025d837_caseD_2;
  case 3:
    goto switchD_0025d837_caseD_3;
  case 4:
    goto switchD_0025d837_caseD_4;
  case 5:
    goto switchD_0025d837_caseD_5;
  case 6:
    goto switchD_0025d837_caseD_6;
  case 7:
    goto switchD_0025d837_caseD_7;
  case 8:
    goto switchD_0025d837_caseD_8;
  case 9:
    goto switchD_0025d837_caseD_9;
  case 10:
    goto switchD_0025d837_caseD_a;
  case 0xb:
    goto switchD_0025d837_caseD_b;
  case 0xc:
    goto switchD_0025d837_caseD_c;
  case 0xd:
    goto switchD_0025d837_caseD_d;
  case 0xe:
    goto switchD_0025d837_caseD_e;
  case 0xf:
    goto switchD_0025d837_caseD_f;
  case 0x10:
    goto switchD_0025d837_caseD_10;
  case 0x11:
    goto switchD_0025d837_caseD_11;
  case 0x12:
    goto switchD_0025d837_caseD_12;
  case 0x13:
    goto switchD_0025d837_caseD_13;
  case 0x14:
    goto switchD_0025d837_caseD_14;
  case 0x15:
    goto switchD_0025d837_caseD_15;
  case 0x16:
    goto switchD_0025d837_caseD_16;
  case 0x17:
    goto switchD_0025d837_caseD_17;
  case 0x18:
    goto switchD_0025d837_caseD_18;
  case 0x19:
    goto switchD_0025d837_caseD_19;
  case 0x1a:
    goto switchD_0025d837_caseD_1a;
  case 0x1b:
    goto switchD_0025d837_caseD_1b;
  case 0x1c:
    goto switchD_0025d837_caseD_1c;
  case 0x1d:
    goto switchD_0025d837_caseD_1d;
  case 0x1e:
    goto switchD_0025d837_caseD_1e;
  case 0x1f:
    goto switchD_0025d837_caseD_1f;
  case 0x20:
    goto switchD_0025d837_caseD_20;
  case 0x21:
    goto switchD_0025d837_caseD_21;
  case 0x22:
    goto switchD_0025d837_caseD_22;
  case 0x23:
    goto switchD_0025d837_caseD_23;
  case 0x24:
    goto switchD_0025d837_caseD_24;
  case 0x25:
    goto switchD_0025d837_caseD_25;
  case 0x26:
    goto switchD_0025d837_caseD_26;
  case 0x27:
    goto switchD_0025d837_caseD_27;
  case 0x28:
    goto switchD_0025d837_caseD_28;
  case 0x29:
    goto switchD_0025d837_caseD_29;
  case 0x2a:
    goto switchD_0025d837_caseD_2a;
  case 0x2b:
    goto switchD_0025d837_caseD_2b;
  case 0x2c:
    goto switchD_0025d837_caseD_2c;
  case 0x2d:
    goto switchD_0025d837_caseD_2d;
  case 0x2e:
    goto switchD_0025d837_caseD_2e;
  case 0x2f:
    goto switchD_0025d837_caseD_2f;
  case 0x30:
    goto switchD_0025d837_caseD_30;
  case 0x31:
    goto switchD_0025d837_caseD_31;
  case 0x32:
    goto switchD_0025d837_caseD_32;
  case 0x33:
    goto switchD_0025d837_caseD_33;
  case 0x34:
    goto switchD_0025d837_caseD_34;
  case 0x35:
    goto switchD_0025d837_caseD_35;
  case 0x36:
    goto switchD_0025d837_caseD_36;
  case 0x37:
    goto switchD_0025d837_caseD_37;
  case 0x38:
    goto switchD_0025d837_caseD_38;
  case 0x39:
    goto switchD_0025d837_caseD_39;
  case 0x3a:
    goto switchD_0025d837_caseD_3a;
  case 0x3b:
    goto switchD_0025d837_caseD_3b;
  case 0x3c:
    goto switchD_0025d837_caseD_3c;
  case 0x3d:
    goto switchD_0025d837_caseD_3d;
  case 0x3e:
    goto switchD_0025d837_caseD_3e;
  case 0x3f:
    goto switchD_0025d837_caseD_3f;
  case 0x40:
    goto switchD_0025d837_caseD_40;
  case 0x41:
    goto switchD_0025d837_caseD_41;
  case 0x42:
    goto switchD_0025d837_caseD_42;
  case 0x43:
    goto switchD_0025d837_caseD_43;
  case 0x44:
    goto switchD_0025d837_caseD_44;
  case 0x45:
    goto switchD_0025d837_caseD_45;
  case 0x46:
    goto switchD_0025d837_caseD_46;
  case 0x47:
    goto switchD_0025d837_caseD_47;
  case 0x48:
    goto switchD_0025d837_caseD_48;
  case 0x49:
    goto switchD_0025d837_caseD_49;
  case 0x4a:
    goto switchD_0025d837_caseD_4a;
  case 0x4b:
    goto switchD_0025d837_caseD_4b;
  case 0x4c:
    goto switchD_0025d837_caseD_4c;
  case 0x4d:
    goto switchD_0025d837_caseD_4d;
  case 0x4e:
    goto switchD_0025d837_caseD_4e;
  case 0x4f:
    goto switchD_0025d837_caseD_4f;
  case 0x50:
    goto switchD_0025d837_caseD_50;
  case 0x51:
    goto switchD_0025d837_caseD_51;
  case 0x52:
    goto switchD_0025d837_caseD_52;
  case 0x53:
    goto switchD_0025d837_caseD_53;
  case 0x54:
    goto switchD_0025d837_caseD_54;
  case 0x55:
    goto switchD_0025d837_caseD_55;
  case 0x56:
    goto switchD_0025d837_caseD_56;
  case 0x57:
    goto switchD_0025d837_caseD_57;
  case 0x58:
    goto switchD_0025d837_caseD_58;
  case 0x59:
    goto switchD_0025d837_caseD_59;
  case 0x5a:
    goto switchD_0025d837_caseD_5a;
  case 0x5b:
    goto switchD_0025d837_caseD_5b;
  case 0x5c:
    goto switchD_0025d837_caseD_5c;
  case 0x5d:
    goto switchD_0025d837_caseD_5d;
  case 0x5e:
    goto switchD_0025d837_caseD_5e;
  case 0x5f:
    goto switchD_0025d837_caseD_5f;
  case 0x60:
    goto switchD_0025d837_caseD_60;
  case 0x61:
    goto switchD_0025d837_caseD_61;
  case 0x62:
    goto switchD_0025d837_caseD_62;
  case 99:
    goto switchD_0025d837_caseD_63;
  case 100:
    goto switchD_0025d837_caseD_64;
  case 0x65:
    goto switchD_0025d837_caseD_65;
  case 0x66:
    goto switchD_0025d837_caseD_66;
  case 0x67:
    goto switchD_0025d837_caseD_67;
  case 0x68:
    goto switchD_0025d837_caseD_68;
  case 0x69:
    goto switchD_0025d837_caseD_69;
  case 0x6a:
    goto switchD_0025d837_caseD_6a;
  case 0x6b:
    goto switchD_0025d837_caseD_6b;
  case 0x6c:
    goto switchD_0025d837_caseD_6c;
  case 0x6d:
    goto switchD_0025d837_caseD_6d;
  case 0x6e:
    goto switchD_0025d837_caseD_6e;
  case 0x6f:
    goto switchD_0025d837_caseD_6f;
  case 0x70:
    goto switchD_0025d837_caseD_70;
  case 0x71:
    goto switchD_0025d837_caseD_71;
  case 0x72:
    goto switchD_0025d837_caseD_72;
  case 0x73:
    goto switchD_0025d837_caseD_73;
  case 0x74:
    goto switchD_0025d837_caseD_74;
  case 0x75:
    goto switchD_0025d837_caseD_75;
  case 0x76:
    goto switchD_0025d837_caseD_76;
  case 0x77:
    goto switchD_0025d837_caseD_77;
  case 0x78:
    goto switchD_0025d837_caseD_78;
  case 0x79:
    goto switchD_0025d837_caseD_79;
  case 0x7a:
    goto switchD_0025d837_caseD_7a;
  case 0x7b:
    goto switchD_0025d837_caseD_7b;
  case 0x7c:
    goto switchD_0025d837_caseD_7c;
  case 0x7d:
    goto switchD_0025d837_caseD_7d;
  case 0x7e:
    goto switchD_0025d837_caseD_7e;
  case 0x7f:
    goto switchD_0025d837_caseD_7f;
  case 0x80:
    goto switchD_0025d837_caseD_80;
  case 0x81:
    goto switchD_0025d837_caseD_81;
  case 0x82:
    goto switchD_0025d837_caseD_82;
  case 0x83:
    goto switchD_0025d837_caseD_83;
  case 0x84:
    goto switchD_0025d837_caseD_84;
  case 0x85:
    goto switchD_0025d837_caseD_85;
  case 0x86:
    goto switchD_0025d837_caseD_86;
  case 0x87:
    goto switchD_0025d837_caseD_87;
  case 0x88:
    goto switchD_0025d837_caseD_88;
  case 0x89:
    goto switchD_0025d837_caseD_89;
  case 0x8a:
    goto switchD_0025d837_caseD_8a;
  case 0x8b:
    goto switchD_0025d837_caseD_8b;
  case 0x8c:
    goto switchD_0025d837_caseD_8c;
  case 0x8d:
    goto switchD_0025d837_caseD_8d;
  case 0x8e:
    goto switchD_0025d837_caseD_8e;
  case 0x8f:
    goto switchD_0025d837_caseD_8f;
  case 0x90:
    goto switchD_0025d837_caseD_90;
  case 0x91:
    goto switchD_0025d837_caseD_91;
  case 0x92:
    goto switchD_0025d837_caseD_92;
  case 0x93:
    goto switchD_0025d837_caseD_93;
  case 0x94:
    goto switchD_0025d837_caseD_94;
  case 0x95:
    goto switchD_0025d837_caseD_95;
  case 0x96:
    goto switchD_0025d837_caseD_96;
  case 0x97:
    goto switchD_0025d837_caseD_97;
  case 0x98:
    goto switchD_0025d837_caseD_98;
  case 0x99:
    goto switchD_0025d837_caseD_99;
  case 0x9a:
    goto switchD_0025d837_caseD_9a;
  case 0x9b:
    goto switchD_0025d837_caseD_9b;
  case 0x9c:
    goto switchD_0025d837_caseD_9c;
  case 0x9d:
    goto switchD_0025d837_caseD_9d;
  case 0x9e:
    goto switchD_0025d837_caseD_9e;
  case 0x9f:
    goto switchD_0025d837_caseD_9f;
  case 0xa0:
    goto switchD_0025d837_caseD_a0;
  case 0xa1:
    goto switchD_0025d837_caseD_a1;
  case 0xa2:
    goto switchD_0025d837_caseD_a2;
  case 0xa3:
    goto switchD_0025d837_caseD_a3;
  case 0xa4:
    goto switchD_0025d837_caseD_a4;
  case 0xa5:
    goto switchD_0025d837_caseD_a5;
  case 0xa6:
    goto switchD_0025d837_caseD_a6;
  case 0xa7:
    goto switchD_0025d837_caseD_a7;
  case 0xa8:
    goto switchD_0025d837_caseD_a8;
  case 0xa9:
    goto switchD_0025d837_caseD_a9;
  case 0xaa:
    goto switchD_0025d837_caseD_aa;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Components/9918/Implementation/../Implementation/Fetch.hpp"
                  ,0x3b,
                  "void TI::TMS::Base<TI::TMS::SMS2VDP>::dispatch(SequencerT &, int, int) [personality = TI::TMS::SMS2VDP, use_end = true, Fetcher = TI::TMS::CharacterSequencer<TI::TMS::SMS2VDP>]"
                 );
  }
  CharacterSequencer<(TI::TMS::Personality)4>::fetch<0>(fetcher);
  if (end == 1) {
    return;
  }
switchD_0025d837_caseD_1:
  CharacterSequencer<(TI::TMS::Personality)4>::fetch<1>(fetcher);
  if (end != 2) {
switchD_0025d837_caseD_2:
    CharacterSequencer<(TI::TMS::Personality)4>::fetch<2>(fetcher);
    if (end != 3) {
switchD_0025d837_caseD_3:
      CharacterSequencer<(TI::TMS::Personality)4>::fetch<3>(fetcher);
      if (end != 4) {
switchD_0025d837_caseD_4:
        CharacterSequencer<(TI::TMS::Personality)4>::fetch<4>(fetcher);
        if (end != 5) {
switchD_0025d837_caseD_5:
          CharacterSequencer<(TI::TMS::Personality)4>::fetch<5>(fetcher);
          if (end != 6) {
switchD_0025d837_caseD_6:
            CharacterSequencer<(TI::TMS::Personality)4>::fetch<6>(fetcher);
            if (end != 7) {
switchD_0025d837_caseD_7:
              CharacterSequencer<(TI::TMS::Personality)4>::fetch<7>(fetcher);
              if (end != 8) {
switchD_0025d837_caseD_8:
                CharacterSequencer<(TI::TMS::Personality)4>::fetch<8>(fetcher);
                if (end != 9) {
switchD_0025d837_caseD_9:
                  CharacterSequencer<(TI::TMS::Personality)4>::fetch<9>(fetcher);
                  if (end != 10) {
switchD_0025d837_caseD_a:
                    CharacterSequencer<(TI::TMS::Personality)4>::fetch<10>(fetcher);
                    if (end != 0xb) {
switchD_0025d837_caseD_b:
                      CharacterSequencer<(TI::TMS::Personality)4>::fetch<11>(fetcher);
                      if (end != 0xc) {
switchD_0025d837_caseD_c:
                        CharacterSequencer<(TI::TMS::Personality)4>::fetch<12>(fetcher);
                        if (end != 0xd) {
switchD_0025d837_caseD_d:
                          CharacterSequencer<(TI::TMS::Personality)4>::fetch<13>(fetcher);
                          if (end != 0xe) {
switchD_0025d837_caseD_e:
                            CharacterSequencer<(TI::TMS::Personality)4>::fetch<14>(fetcher);
                            if (end != 0xf) {
switchD_0025d837_caseD_f:
                              CharacterSequencer<(TI::TMS::Personality)4>::fetch<15>(fetcher);
                              if (end != 0x10) {
switchD_0025d837_caseD_10:
                                CharacterSequencer<(TI::TMS::Personality)4>::fetch<16>(fetcher);
                                if (end != 0x11) {
switchD_0025d837_caseD_11:
                                  CharacterSequencer<(TI::TMS::Personality)4>::fetch<17>(fetcher);
                                  if (end != 0x12) {
switchD_0025d837_caseD_12:
                                    CharacterSequencer<(TI::TMS::Personality)4>::fetch<18>(fetcher);
                                    if (end != 0x13) {
switchD_0025d837_caseD_13:
                                      CharacterSequencer<(TI::TMS::Personality)4>::fetch<19>
                                                (fetcher);
                                      if (end != 0x14) {
switchD_0025d837_caseD_14:
                                        CharacterSequencer<(TI::TMS::Personality)4>::fetch<20>
                                                  (fetcher);
                                        if (end != 0x15) {
switchD_0025d837_caseD_15:
                                          CharacterSequencer<(TI::TMS::Personality)4>::fetch<21>
                                                    (fetcher);
                                          if (end != 0x16) {
switchD_0025d837_caseD_16:
                                            CharacterSequencer<(TI::TMS::Personality)4>::fetch<22>
                                                      (fetcher);
                                            if (end != 0x17) {
switchD_0025d837_caseD_17:
                                              CharacterSequencer<(TI::TMS::Personality)4>::fetch<23>
                                                        (fetcher);
                                              if (end != 0x18) {
switchD_0025d837_caseD_18:
                                                CharacterSequencer<(TI::TMS::Personality)4>::
                                                fetch<24>(fetcher);
                                                if (end != 0x19) {
switchD_0025d837_caseD_19:
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<25>(fetcher);
                                                  if (end != 0x1a) {
switchD_0025d837_caseD_1a:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<26>(fetcher);
                                                    if (end != 0x1b) {
switchD_0025d837_caseD_1b:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<27>(fetcher);
                                                      if (end != 0x1c) {
switchD_0025d837_caseD_1c:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<28>(fetcher);
                                                        if (end != 0x1d) {
switchD_0025d837_caseD_1d:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<29>(fetcher);
                                                  if (end != 0x1e) {
switchD_0025d837_caseD_1e:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<30>(fetcher);
                                                    if (end != 0x1f) {
switchD_0025d837_caseD_1f:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<31>(fetcher);
                                                      if (end != 0x20) {
switchD_0025d837_caseD_20:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<32>(fetcher);
                                                        if (end != 0x21) {
switchD_0025d837_caseD_21:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<33>(fetcher);
                                                  if (end != 0x22) {
switchD_0025d837_caseD_22:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<34>(fetcher);
                                                    if (end != 0x23) {
switchD_0025d837_caseD_23:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<35>(fetcher);
                                                      if (end != 0x24) {
switchD_0025d837_caseD_24:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<36>(fetcher);
                                                        if (end != 0x25) {
switchD_0025d837_caseD_25:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<37>(fetcher);
                                                  if (end != 0x26) {
switchD_0025d837_caseD_26:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<38>(fetcher);
                                                    if (end != 0x27) {
switchD_0025d837_caseD_27:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<39>(fetcher);
                                                      if (end != 0x28) {
switchD_0025d837_caseD_28:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<40>(fetcher);
                                                        if (end != 0x29) {
switchD_0025d837_caseD_29:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<41>(fetcher);
                                                  if (end != 0x2a) {
switchD_0025d837_caseD_2a:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<42>(fetcher);
                                                    if (end != 0x2b) {
switchD_0025d837_caseD_2b:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<43>(fetcher);
                                                      if (end != 0x2c) {
switchD_0025d837_caseD_2c:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<44>(fetcher);
                                                        if (end != 0x2d) {
switchD_0025d837_caseD_2d:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<45>(fetcher);
                                                  if (end != 0x2e) {
switchD_0025d837_caseD_2e:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<46>(fetcher);
                                                    if (end != 0x2f) {
switchD_0025d837_caseD_2f:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<47>(fetcher);
                                                      if (end != 0x30) {
switchD_0025d837_caseD_30:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<48>(fetcher);
                                                        if (end != 0x31) {
switchD_0025d837_caseD_31:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<49>(fetcher);
                                                  if (end != 0x32) {
switchD_0025d837_caseD_32:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<50>(fetcher);
                                                    if (end != 0x33) {
switchD_0025d837_caseD_33:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<51>(fetcher);
                                                      if (end != 0x34) {
switchD_0025d837_caseD_34:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<52>(fetcher);
                                                        if (end != 0x35) {
switchD_0025d837_caseD_35:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<53>(fetcher);
                                                  if (end != 0x36) {
switchD_0025d837_caseD_36:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<54>(fetcher);
                                                    if (end != 0x37) {
switchD_0025d837_caseD_37:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<55>(fetcher);
                                                      if (end != 0x38) {
switchD_0025d837_caseD_38:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<56>(fetcher);
                                                        if (end != 0x39) {
switchD_0025d837_caseD_39:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<57>(fetcher);
                                                  if (end != 0x3a) {
switchD_0025d837_caseD_3a:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<58>(fetcher);
                                                    if (end != 0x3b) {
switchD_0025d837_caseD_3b:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<59>(fetcher);
                                                      if (end != 0x3c) {
switchD_0025d837_caseD_3c:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<60>(fetcher);
                                                        if (end != 0x3d) {
switchD_0025d837_caseD_3d:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<61>(fetcher);
                                                  if (end != 0x3e) {
switchD_0025d837_caseD_3e:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<62>(fetcher);
                                                    if (end != 0x3f) {
switchD_0025d837_caseD_3f:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<63>(fetcher);
                                                      if (end != 0x40) {
switchD_0025d837_caseD_40:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<64>(fetcher);
                                                        if (end != 0x41) {
switchD_0025d837_caseD_41:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<65>(fetcher);
                                                  if (end != 0x42) {
switchD_0025d837_caseD_42:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<66>(fetcher);
                                                    if (end != 0x43) {
switchD_0025d837_caseD_43:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<67>(fetcher);
                                                      if (end != 0x44) {
switchD_0025d837_caseD_44:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<68>(fetcher);
                                                        if (end != 0x45) {
switchD_0025d837_caseD_45:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<69>(fetcher);
                                                  if (end != 0x46) {
switchD_0025d837_caseD_46:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<70>(fetcher);
                                                    if (end != 0x47) {
switchD_0025d837_caseD_47:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<71>(fetcher);
                                                      if (end != 0x48) {
switchD_0025d837_caseD_48:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<72>(fetcher);
                                                        if (end != 0x49) {
switchD_0025d837_caseD_49:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<73>(fetcher);
                                                  if (end != 0x4a) {
switchD_0025d837_caseD_4a:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<74>(fetcher);
                                                    if (end != 0x4b) {
switchD_0025d837_caseD_4b:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<75>(fetcher);
                                                      if (end != 0x4c) {
switchD_0025d837_caseD_4c:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<76>(fetcher);
                                                        if (end != 0x4d) {
switchD_0025d837_caseD_4d:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<77>(fetcher);
                                                  if (end != 0x4e) {
switchD_0025d837_caseD_4e:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<78>(fetcher);
                                                    if (end != 0x4f) {
switchD_0025d837_caseD_4f:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<79>(fetcher);
                                                      if (end != 0x50) {
switchD_0025d837_caseD_50:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<80>(fetcher);
                                                        if (end != 0x51) {
switchD_0025d837_caseD_51:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<81>(fetcher);
                                                  if (end != 0x52) {
switchD_0025d837_caseD_52:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<82>(fetcher);
                                                    if (end != 0x53) {
switchD_0025d837_caseD_53:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<83>(fetcher);
                                                      if (end != 0x54) {
switchD_0025d837_caseD_54:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<84>(fetcher);
                                                        if (end != 0x55) {
switchD_0025d837_caseD_55:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<85>(fetcher);
                                                  if (end != 0x56) {
switchD_0025d837_caseD_56:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<86>(fetcher);
                                                    if (end != 0x57) {
switchD_0025d837_caseD_57:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<87>(fetcher);
                                                      if (end != 0x58) {
switchD_0025d837_caseD_58:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<88>(fetcher);
                                                        if (end != 0x59) {
switchD_0025d837_caseD_59:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<89>(fetcher);
                                                  if (end != 0x5a) {
switchD_0025d837_caseD_5a:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<90>(fetcher);
                                                    if (end != 0x5b) {
switchD_0025d837_caseD_5b:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<91>(fetcher);
                                                      if (end != 0x5c) {
switchD_0025d837_caseD_5c:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<92>(fetcher);
                                                        if (end != 0x5d) {
switchD_0025d837_caseD_5d:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<93>(fetcher);
                                                  if (end != 0x5e) {
switchD_0025d837_caseD_5e:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<94>(fetcher);
                                                    if (end != 0x5f) {
switchD_0025d837_caseD_5f:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<95>(fetcher);
                                                      if (end != 0x60) {
switchD_0025d837_caseD_60:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<96>(fetcher);
                                                        if (end != 0x61) {
switchD_0025d837_caseD_61:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<97>(fetcher);
                                                  if (end != 0x62) {
switchD_0025d837_caseD_62:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<98>(fetcher);
                                                    if (end != 99) {
switchD_0025d837_caseD_63:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<99>(fetcher);
                                                      if (end != 100) {
switchD_0025d837_caseD_64:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<100>(fetcher);
                                                        if (end != 0x65) {
switchD_0025d837_caseD_65:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<101>(fetcher);
                                                  if (end != 0x66) {
switchD_0025d837_caseD_66:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<102>(fetcher);
                                                    if (end != 0x67) {
switchD_0025d837_caseD_67:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<103>(fetcher);
                                                      if (end != 0x68) {
switchD_0025d837_caseD_68:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<104>(fetcher);
                                                        if (end != 0x69) {
switchD_0025d837_caseD_69:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<105>(fetcher);
                                                  if (end != 0x6a) {
switchD_0025d837_caseD_6a:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<106>(fetcher);
                                                    if (end != 0x6b) {
switchD_0025d837_caseD_6b:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<107>(fetcher);
                                                      if (end != 0x6c) {
switchD_0025d837_caseD_6c:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<108>(fetcher);
                                                        if (end != 0x6d) {
switchD_0025d837_caseD_6d:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<109>(fetcher);
                                                  if (end != 0x6e) {
switchD_0025d837_caseD_6e:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<110>(fetcher);
                                                    if (end != 0x6f) {
switchD_0025d837_caseD_6f:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<111>(fetcher);
                                                      if (end != 0x70) {
switchD_0025d837_caseD_70:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<112>(fetcher);
                                                        if (end != 0x71) {
switchD_0025d837_caseD_71:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<113>(fetcher);
                                                  if (end != 0x72) {
switchD_0025d837_caseD_72:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<114>(fetcher);
                                                    if (end != 0x73) {
switchD_0025d837_caseD_73:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<115>(fetcher);
                                                      if (end != 0x74) {
switchD_0025d837_caseD_74:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<116>(fetcher);
                                                        if (end != 0x75) {
switchD_0025d837_caseD_75:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<117>(fetcher);
                                                  if (end != 0x76) {
switchD_0025d837_caseD_76:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<118>(fetcher);
                                                    if (end != 0x77) {
switchD_0025d837_caseD_77:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<119>(fetcher);
                                                      if (end != 0x78) {
switchD_0025d837_caseD_78:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<120>(fetcher);
                                                        if (end != 0x79) {
switchD_0025d837_caseD_79:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<121>(fetcher);
                                                  if (end != 0x7a) {
switchD_0025d837_caseD_7a:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<122>(fetcher);
                                                    if (end != 0x7b) {
switchD_0025d837_caseD_7b:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<123>(fetcher);
                                                      if (end != 0x7c) {
switchD_0025d837_caseD_7c:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<124>(fetcher);
                                                        if (end != 0x7d) {
switchD_0025d837_caseD_7d:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<125>(fetcher);
                                                  if (end != 0x7e) {
switchD_0025d837_caseD_7e:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<126>(fetcher);
                                                    if (end != 0x7f) {
switchD_0025d837_caseD_7f:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<127>(fetcher);
                                                      if (end != 0x80) {
switchD_0025d837_caseD_80:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<128>(fetcher);
                                                        if (end != 0x81) {
switchD_0025d837_caseD_81:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<129>(fetcher);
                                                  if (end != 0x82) {
switchD_0025d837_caseD_82:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<130>(fetcher);
                                                    if (end != 0x83) {
switchD_0025d837_caseD_83:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<131>(fetcher);
                                                      if (end != 0x84) {
switchD_0025d837_caseD_84:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<132>(fetcher);
                                                        if (end != 0x85) {
switchD_0025d837_caseD_85:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<133>(fetcher);
                                                  if (end != 0x86) {
switchD_0025d837_caseD_86:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<134>(fetcher);
                                                    if (end != 0x87) {
switchD_0025d837_caseD_87:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<135>(fetcher);
                                                      if (end != 0x88) {
switchD_0025d837_caseD_88:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<136>(fetcher);
                                                        if (end != 0x89) {
switchD_0025d837_caseD_89:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<137>(fetcher);
                                                  if (end != 0x8a) {
switchD_0025d837_caseD_8a:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<138>(fetcher);
                                                    if (end != 0x8b) {
switchD_0025d837_caseD_8b:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<139>(fetcher);
                                                      if (end != 0x8c) {
switchD_0025d837_caseD_8c:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<140>(fetcher);
                                                        if (end != 0x8d) {
switchD_0025d837_caseD_8d:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<141>(fetcher);
                                                  if (end != 0x8e) {
switchD_0025d837_caseD_8e:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<142>(fetcher);
                                                    if (end != 0x8f) {
switchD_0025d837_caseD_8f:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<143>(fetcher);
                                                      if (end != 0x90) {
switchD_0025d837_caseD_90:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<144>(fetcher);
                                                        if (end != 0x91) {
switchD_0025d837_caseD_91:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<145>(fetcher);
                                                  if (end != 0x92) {
switchD_0025d837_caseD_92:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<146>(fetcher);
                                                    if (end != 0x93) {
switchD_0025d837_caseD_93:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<147>(fetcher);
                                                      if (end != 0x94) {
switchD_0025d837_caseD_94:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<148>(fetcher);
                                                        if (end != 0x95) {
switchD_0025d837_caseD_95:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<149>(fetcher);
                                                  if (end != 0x96) {
switchD_0025d837_caseD_96:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<150>(fetcher);
                                                    if (end != 0x97) {
switchD_0025d837_caseD_97:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<151>(fetcher);
                                                      if (end != 0x98) {
switchD_0025d837_caseD_98:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<152>(fetcher);
                                                        if (end != 0x99) {
switchD_0025d837_caseD_99:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<153>(fetcher);
                                                  if (end != 0x9a) {
switchD_0025d837_caseD_9a:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<154>(fetcher);
                                                    if (end != 0x9b) {
switchD_0025d837_caseD_9b:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<155>(fetcher);
                                                      if (end != 0x9c) {
switchD_0025d837_caseD_9c:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<156>(fetcher);
                                                        if (end != 0x9d) {
switchD_0025d837_caseD_9d:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<157>(fetcher);
                                                  if (end != 0x9e) {
switchD_0025d837_caseD_9e:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<158>(fetcher);
                                                    if (end != 0x9f) {
switchD_0025d837_caseD_9f:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<159>(fetcher);
                                                      if (end != 0xa0) {
switchD_0025d837_caseD_a0:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<160>(fetcher);
                                                        if (end != 0xa1) {
switchD_0025d837_caseD_a1:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<161>(fetcher);
                                                  if (end != 0xa2) {
switchD_0025d837_caseD_a2:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<162>(fetcher);
                                                    if (end != 0xa3) {
switchD_0025d837_caseD_a3:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<163>(fetcher);
                                                      if (end != 0xa4) {
switchD_0025d837_caseD_a4:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<164>(fetcher);
                                                        if (end != 0xa5) {
switchD_0025d837_caseD_a5:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<165>(fetcher);
                                                  if (end != 0xa6) {
switchD_0025d837_caseD_a6:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<166>(fetcher);
                                                    if (end != 0xa7) {
switchD_0025d837_caseD_a7:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<167>(fetcher);
                                                      if (end != 0xa8) {
switchD_0025d837_caseD_a8:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<168>(fetcher);
                                                        if (end != 0xa9) {
switchD_0025d837_caseD_a9:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<169>(fetcher);
                                                  if (end != 0xaa) {
switchD_0025d837_caseD_aa:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<170>(fetcher);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Base<personality>::dispatch(SequencerT &fetcher, int start, int end) {
#define index(n)						\
	if(use_end && end == n) return;		\
	[[fallthrough]];					\
	case n: fetcher.template fetch<from_internal<personality, Clock::FromStartOfSync>(n)>();

	switch(start) {
		default: assert(false);
		index(0);	index(1);	index(2);	index(3);	index(4);	index(5);	index(6);	index(7);	index(8);	index(9);
		index(10);	index(11);	index(12);	index(13);	index(14);	index(15);	index(16);	index(17);	index(18);	index(19);
		index(20);	index(21);	index(22);	index(23);	index(24);	index(25);	index(26);	index(27);	index(28);	index(29);
		index(30);	index(31);	index(32);	index(33);	index(34);	index(35);	index(36);	index(37);	index(38);	index(39);
		index(40);	index(41);	index(42);	index(43);	index(44);	index(45);	index(46);	index(47);	index(48);	index(49);
		index(50);	index(51);	index(52);	index(53);	index(54);	index(55);	index(56);	index(57);	index(58);	index(59);
		index(60);	index(61);	index(62);	index(63);	index(64);	index(65);	index(66);	index(67);	index(68);	index(69);
		index(70);	index(71);	index(72);	index(73);	index(74);	index(75);	index(76);	index(77);	index(78);	index(79);
		index(80);	index(81);	index(82);	index(83);	index(84);	index(85);	index(86);	index(87);	index(88);	index(89);
		index(90);	index(91);	index(92);	index(93);	index(94);	index(95);	index(96);	index(97);	index(98);	index(99);
		index(100);	index(101);	index(102);	index(103);	index(104);	index(105);	index(106);	index(107);	index(108);	index(109);
		index(110);	index(111);	index(112);	index(113);	index(114);	index(115);	index(116);	index(117);	index(118);	index(119);
		index(120);	index(121);	index(122);	index(123);	index(124);	index(125);	index(126);	index(127);	index(128);	index(129);
		index(130);	index(131);	index(132);	index(133);	index(134);	index(135);	index(136);	index(137);	index(138);	index(139);
		index(140);	index(141);	index(142);	index(143);	index(144);	index(145);	index(146);	index(147);	index(148);	index(149);
		index(150);	index(151);	index(152);	index(153);	index(154);	index(155);	index(156);	index(157);	index(158);	index(159);
		index(160);	index(161);	index(162);	index(163);	index(164);	index(165);	index(166);	index(167);	index(168);	index(169);
		index(170);
	}

#undef index
}